

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_type(lyout *out,int level,lys_module *module,lys_type *type)

{
  uint8_t uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  lys_module *plVar6;
  char *pcVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  lys_type *plVar10;
  lys_restr *plVar11;
  lys_type_bit *plVar12;
  uint endflag;
  ulong uVar13;
  lyout *plVar14;
  long lVar15;
  char *local_78;
  char *s;
  ulong local_68;
  ulong local_60;
  uint local_58;
  int local_54;
  lys_module *local_50;
  int local_44;
  lyout *plStack_40;
  int content2;
  lys_type *local_38;
  
  local_44 = 0;
  plStack_40 = out;
  local_38 = type;
  iVar4 = lys_type_is_local(type);
  plVar10 = local_38;
  if (iVar4 == 0) {
    plVar6 = lys_main_module(local_38->der->module);
    pcVar7 = transform_module_name2import_prefix(module,plVar6->name);
    ly_print(plStack_40,"%*s<type name=\"%s:%s\"",(ulong)(uint)(level * 2),"",pcVar7,
             plVar10->der->name);
  }
  else {
    yin_print_open(plStack_40,level,(char *)0x0,"type","name",local_38->der->name,0);
  }
  plVar14 = plStack_40;
  iVar4 = level + 1;
  uVar1 = local_38->ext_size;
  local_68 = (ulong)(uint)level;
  if (uVar1 != '\0') {
    ly_print(plStack_40,">\n");
    yin_print_extension_instances
              (plVar14,iVar4,module,LYEXT_SUBSTMT_SELF,'\0',local_38->ext,(uint)local_38->ext_size);
  }
  plVar10 = local_38;
  endflag = (uint)(uVar1 != '\0');
  local_54 = iVar4;
  local_50 = module;
  switch(local_38->base) {
  case LY_TYPE_BINARY:
    plVar11 = (local_38->info).dec64.range;
    if (plVar11 == (lys_restr *)0x0) break;
    if (uVar1 == '\0') {
      ly_print(plStack_40,">\n");
      plVar11 = (local_38->info).dec64.range;
    }
    pcVar7 = "length";
    module = local_50;
    goto LAB_0018eb6b;
  case LY_TYPE_BITS:
    if ((local_38->info).bits.count != 0) {
      s._4_4_ = (int)local_68 + 2;
      lVar15 = 0;
      uVar13 = 0;
      do {
        local_44 = 0;
        local_60 = uVar13;
        if (endflag == 0) {
          ly_print(plStack_40,">\n");
          endflag = 1;
        }
        local_58 = endflag;
        plVar10 = local_38;
        plVar14 = plStack_40;
        yin_print_open(plStack_40,iVar4,(char *)0x0,"bit","name",
                       *(char **)((long)&((local_38->info).bits.bit)->name + lVar15),local_44);
        iVar4 = s._4_4_;
        yin_print_snode_common
                  (plVar14,s._4_4_,(lys_node *)((long)&((plVar10->info).bits.bit)->name + lVar15),
                   local_50,&local_44,3);
        plVar12 = (plVar10->info).bits.bit;
        plVar10 = local_38;
        plVar6 = local_50;
        plVar14 = plStack_40;
        if ((*(byte *)((long)&plVar12->flags + lVar15) & 1) == 0) {
          if (local_44 == 0) {
            local_44 = 1;
            ly_print(plStack_40,">\n");
            plVar12 = (local_38->info).bits.bit;
          }
          plVar10 = local_38;
          plVar14 = plStack_40;
          plVar6 = local_50;
          yin_print_unsigned(plStack_40,iVar4,LYEXT_SUBSTMT_POSITION,'\0',local_50,
                             *(lys_ext_instance ***)((long)&plVar12->ext + lVar15),
                             (uint)(&plVar12->ext_size)[lVar15],
                             *(uint *)((long)&plVar12->pos + lVar15));
          plVar12 = (plVar10->info).bits.bit;
        }
        uVar13 = local_60;
        yin_print_snode_common
                  (plVar14,iVar4,(lys_node *)((long)&plVar12->name + lVar15),plVar6,&local_44,0x70);
        iVar4 = local_54;
        yin_print_close(plVar14,local_54,(char *)0x0,"bit",local_44);
        uVar13 = uVar13 + 1;
        lVar15 = lVar15 + 0x30;
        endflag = local_58;
      } while (uVar13 < (plVar10->info).bits.count);
    }
    break;
  case LY_TYPE_DEC64:
    if ((local_38->der->type).der == (lys_tpdf *)0x0) {
      if (uVar1 == '\0') {
        ly_print(plStack_40,">\n");
      }
      plVar10 = local_38;
      yin_print_unsigned(plStack_40,iVar4,LYEXT_SUBSTMT_DIGITS,'\0',module,local_38->ext,
                         (uint)local_38->ext_size,(uint)(local_38->info).dec64.dig);
      plVar11 = (plVar10->info).dec64.range;
      if (plVar11 == (lys_restr *)0x0) goto LAB_0018eb70;
    }
    else {
      plVar11 = (local_38->info).dec64.range;
      if (plVar11 == (lys_restr *)0x0) break;
      if (uVar1 == '\0') {
        ly_print(plStack_40,">\n");
        plVar11 = (local_38->info).dec64.range;
      }
    }
    pcVar7 = "range";
    goto LAB_0018eb6b;
  case LY_TYPE_ENUM:
    if ((local_38->info).bits.count != 0) {
      local_60 = CONCAT44(local_60._4_4_,(int)local_68 + 2);
      lVar15 = 0;
      uVar13 = 0;
      do {
        local_44 = 0;
        if (endflag == 0) {
          ly_print(plStack_40,">\n");
          endflag = 1;
        }
        local_58 = endflag;
        plVar10 = local_38;
        plVar14 = plStack_40;
        yin_print_open(plStack_40,iVar4,(char *)0x0,"enum","name",
                       *(char **)((long)&((local_38->info).bits.bit)->name + lVar15),local_44);
        iVar4 = (int)local_60;
        iVar5 = 0x18ef6d;
        yin_print_snode_common
                  (plVar14,(int)local_60,
                   (lys_node *)((long)&((plVar10->info).bits.bit)->name + lVar15),local_50,&local_44
                   ,3);
        plVar12 = (plVar10->info).bits.bit;
        plVar6 = local_50;
        plVar14 = plStack_40;
        if ((*(byte *)((long)&plVar12->flags + lVar15) & 1) == 0) {
          if (local_44 == 0) {
            local_44 = 1;
            iVar5 = 0x18ef99;
            ly_print(plStack_40,">\n");
            plVar12 = (local_38->info).bits.bit;
          }
          plVar14 = plStack_40;
          plVar6 = local_50;
          yin_print_signed(plStack_40,iVar4,LYEXT_SUBSTMT_SELF,(uint8_t)local_50,
                           *(lys_module **)((long)&plVar12->ext + lVar15),
                           (lys_ext_instance **)(ulong)(&plVar12->ext_size)[lVar15],
                           *(uint *)((long)&plVar12->pos + lVar15),iVar5);
          plVar12 = (local_38->info).bits.bit;
        }
        yin_print_snode_common
                  (plVar14,iVar4,(lys_node *)((long)&plVar12->name + lVar15),plVar6,&local_44,0x70);
        iVar4 = local_54;
        yin_print_close(plVar14,local_54,(char *)0x0,"enum",local_44);
        uVar13 = uVar13 + 1;
        lVar15 = lVar15 + 0x30;
        endflag = local_58;
      } while (uVar13 < (local_38->info).bits.count);
    }
    break;
  case LY_TYPE_IDENT:
    if ((local_38->info).bits.count == 0) break;
    if ((uVar1 != '\0') || (ly_print(plStack_40,">\n"), (local_38->info).bits.count != 0)) {
      plVar6 = local_50;
      uVar13 = 0;
      do {
        plVar8 = lys_main_module(*(lys_module **)
                                  ((&((local_38->info).bits.bit)->name)[uVar13] + 0x30));
        plVar9 = lys_main_module(plVar6);
        if (plVar9 == plVar8) {
          pcVar7 = (&((local_38->info).bits.bit)->name)[uVar13];
          yin_print_substmt(plStack_40,local_54,LYEXT_SUBSTMT_BASE,'\0',*(char **)pcVar7,plVar6,
                            *(lys_ext_instance ***)(pcVar7 + 0x20),(uint)(byte)pcVar7[0x1a]);
        }
        else {
          pcVar7 = transform_module_name2import_prefix(plVar6,plVar8->name);
          iVar4 = asprintf(&local_78,"%s:%s",pcVar7);
          if (iVar4 == -1) {
            ly_log(plVar6->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_print_type")
            ;
          }
          else {
            pcVar7 = (&((local_38->info).bits.bit)->name)[uVar13];
            yin_print_substmt(plStack_40,local_54,LYEXT_SUBSTMT_BASE,'\0',local_78,plVar6,
                              *(lys_ext_instance ***)(pcVar7 + 0x20),(uint)(byte)pcVar7[0x1a]);
            free(local_78);
          }
        }
        uVar13 = uVar13 + 1;
        endflag = 1;
      } while (uVar13 < (local_38->info).bits.count);
      break;
    }
    goto LAB_0018eb70;
  case LY_TYPE_INST:
    cVar2 = (local_38->info).inst.req;
    if (cVar2 == -1) {
      if (uVar1 == '\0') {
LAB_0018f327:
        ly_print(plStack_40,">\n");
      }
LAB_0018f339:
      bVar3 = local_38->ext_size;
      pcVar7 = "false";
    }
    else {
      if (cVar2 != '\x01') break;
      if (uVar1 == '\0') {
        ly_print(plStack_40,">\n");
      }
      bVar3 = local_38->ext_size;
      pcVar7 = "true";
      module = local_50;
    }
    goto LAB_0018f359;
  case LY_TYPE_LEAFREF:
    iVar5 = ly_strequal_(local_38->der->name,"leafref");
    if (iVar5 != 0) {
      if (uVar1 == '\0') {
        ly_print(plStack_40,">\n");
      }
      plVar10 = local_38;
      pcVar7 = transform_json2schema(module,(local_38->info).lref.path);
      iVar4 = local_54;
      yin_print_substmt(plStack_40,local_54,LYEXT_SUBSTMT_PATH,'\0',pcVar7,module,plVar10->ext,
                        (uint)plVar10->ext_size);
      lydict_remove(module->ctx,pcVar7);
      endflag = 1;
    }
    cVar2 = (local_38->info).lref.req;
    if (cVar2 == -1) {
      if (endflag == 0) goto LAB_0018f327;
      goto LAB_0018f339;
    }
    if (cVar2 != '\x01') break;
    if (endflag == 0) {
      ly_print(plStack_40,">\n");
    }
    bVar3 = local_38->ext_size;
    pcVar7 = "true";
LAB_0018f359:
    yin_print_substmt(plStack_40,iVar4,LYEXT_SUBSTMT_REQINSTANCE,'\0',pcVar7,module,local_38->ext,
                      (uint)bVar3);
    goto LAB_0018eb70;
  case LY_TYPE_STRING:
    plVar11 = (local_38->info).dec64.range;
    if (plVar11 != (lys_restr *)0x0) {
      if (uVar1 == '\0') {
        ly_print(plStack_40,">\n");
        plVar11 = (local_38->info).dec64.range;
      }
      yin_print_typerestr(plStack_40,iVar4,module,plVar11,"length");
      endflag = 1;
    }
    plVar10 = local_38;
    if ((local_38->info).str.pat_count != 0) {
      lVar15 = 0;
      uVar13 = 0;
      do {
        if (endflag == 0) {
          ly_print(plStack_40,">\n");
          endflag = 1;
        }
        yin_print_typerestr(plStack_40,iVar4,local_50,
                            (lys_restr *)(((plVar10->info).lref.target)->padding + lVar15 + -0x1c),
                            "pattern");
        uVar13 = uVar13 + 1;
        lVar15 = lVar15 + 0x38;
      } while (uVar13 < (plVar10->info).str.pat_count);
    }
    break;
  case LY_TYPE_UNION:
    if ((local_38->info).bits.count != 0) {
      lVar15 = 0;
      uVar13 = 0;
      do {
        if (endflag == 0) {
          ly_print(plStack_40,">\n");
          endflag = 1;
        }
        yin_print_type(plStack_40,iVar4,local_50,
                       (lys_type *)((long)&((plVar10->info).bits.bit)->name + lVar15));
        uVar13 = uVar13 + 1;
        lVar15 = lVar15 + 0x40;
      } while (uVar13 < (plVar10->info).bits.count);
    }
    break;
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    plVar11 = (local_38->info).dec64.range;
    if (plVar11 == (lys_restr *)0x0) break;
    if (uVar1 == '\0') {
      ly_print(plStack_40,">\n");
      plVar11 = (local_38->info).dec64.range;
    }
    pcVar7 = "range";
    module = local_50;
LAB_0018eb6b:
    yin_print_typerestr(plStack_40,iVar4,module,plVar11,pcVar7);
LAB_0018eb70:
    endflag = 1;
  }
  yin_print_close(plStack_40,(int)local_68,(char *)0x0,"type",endflag);
  return;
}

Assistant:

static void
yin_print_type(struct lyout *out, int level, const struct lys_module *module, const struct lys_type *type)
{
    unsigned int i;
    int content = 0, content2 = 0;
    const char *str;
    char *s;
    struct lys_module *mod;

    if (!lys_type_is_local(type)) {
        ly_print(out, "%*s<type name=\"%s:%s\"", LEVEL, INDENT,
                 transform_module_name2import_prefix(module, lys_main_module(type->der->module)->name), type->der->name);
    } else {
        yin_print_open(out, level, NULL, "type", "name", type->der->name, content);
    }
    level++;

    /* extensions */
    if (type->ext_size) {
        yin_print_close_parent(out, &content);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, type->ext, type->ext_size);
    }


    switch (type->base) {
    case LY_TYPE_BINARY:
        if (type->info.binary.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.binary.length, "length");
        }
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; ++i) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "bit", "name", type->info.bits.bit[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.bits.bit[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_unsigned(out, level + 1, LYEXT_SUBSTMT_POSITION, 0, module,
                                   type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                   type->info.bits.bit[i].pos);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.bits.bit[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "bit", content2);
        }
        break;
    case LY_TYPE_DEC64:
        if (!type->der->type.der) {
            yin_print_close_parent(out, &content);
            yin_print_unsigned(out, level, LYEXT_SUBSTMT_DIGITS, 0, module,
                               type->ext, type->ext_size, type->info.dec64.dig);
        }
        if (type->info.dec64.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.dec64.range, "range");
        }
        break;
    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            content2 = 0;
            yin_print_close_parent(out, &content);
            yin_print_open(out, level, NULL, "enum", "name", type->info.enums.enm[i].name, content2);
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_EXT | SNODE_COMMON_IFF);
            if (!(type->info.enums.enm[i].flags & LYS_AUTOASSIGNED)) {
                yin_print_close_parent(out, &content2);
                yin_print_signed(out, level + 1, LYEXT_SUBSTMT_VALUE, 0, module,
                                 type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                 type->info.enums.enm[i].value);
            }
            yin_print_snode_common(out, level + 1, (struct lys_node *)&type->info.enums.enm[i], module, &content2,
                                   SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
            yin_print_close(out, level, NULL, "enum", content2);
        }
        break;
    case LY_TYPE_IDENT:
        if (type->info.ident.count) {
            yin_print_close_parent(out, &content);
            for (i = 0; i < type->info.ident.count; ++i) {
                mod = lys_main_module(type->info.ident.ref[i]->module);
                if (lys_main_module(module) == mod) {
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, type->info.ident.ref[i]->name,
                                      module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                } else {
                    if (asprintf(&s, "%s:%s", transform_module_name2import_prefix(module, mod->name),
                                 type->info.ident.ref[i]->name) == -1) {
                        LOGMEM(module->ctx);
                    } else {
                        yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, 0, s,
                                          module, type->info.ident.ref[i]->ext, type->info.ident.ref[i]->ext_size);
                        free(s);
                    }
                }
            }
        }
        break;
    case LY_TYPE_INST:
        if (type->info.inst.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.inst.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        if (type->info.num.range) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.num.range, "range");
        }
        break;
    case LY_TYPE_LEAFREF:
        if (ly_strequal(type->der->name, "leafref", 0)) {
            yin_print_close_parent(out, &content);
            str = transform_json2schema(module, type->info.lref.path);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_PATH, 0, str, module, type->ext, type->ext_size);
            lydict_remove(module->ctx, str);
        }
        if (type->info.lref.req == 1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "true", module, type->ext, type->ext_size);
        } else if (type->info.lref.req == -1) {
            yin_print_close_parent(out, &content);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_REQINSTANCE, 0, "false", module, type->ext, type->ext_size);
        }
        break;
    case LY_TYPE_STRING:
        if (type->info.str.length) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, type->info.str.length, "length");
        }
        for (i = 0; i < type->info.str.pat_count; i++) {
            yin_print_close_parent(out, &content);
            yin_print_typerestr(out, level, module, &type->info.str.patterns[i], "pattern");
        }
        break;
    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; ++i) {
            yin_print_close_parent(out, &content);
            yin_print_type(out, level, module, &type->info.uni.types[i]);
        }
        break;
    default:
        /* other types do not have substatements */
        break;
    }

    level--;
    yin_print_close(out, level, NULL, "type", content);
}